

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prompt.c
# Opt level: O3

kp_error_t kp_readpass(kp_ctx *ctx,_Bool confirm,char *password,char *fmt,__va_list_tag *ap)

{
  int iVar1;
  long lVar2;
  char *__s2;
  int *piVar3;
  char *fmt_00;
  kp_error_t err;
  kp_error_t kVar4;
  char *prompt;
  char *prompt_fmt;
  void *local_30;
  void *local_28;
  
  local_28 = (void *)0x0;
  local_30 = (void *)0x0;
  iVar1 = __asprintf_chk(&local_28,1,"[kickpass] %s password: ");
  if (iVar1 < 0) {
    kp_err(5,"cannot build prompt");
  }
  iVar1 = __vasprintf_chk(&local_30,1,local_28,ap);
  if (iVar1 < 0) {
    kp_err(5,"cannot build prompt");
  }
  lVar2 = readpassphrase(local_30,password,0x1000,2);
  if (lVar2 == 0) {
    fmt_00 = "cannot read password";
LAB_001052e6:
    __s2 = (char *)0x0;
LAB_001052e9:
    kVar4 = 5;
    err = 5;
  }
  else {
    kVar4 = 0;
    if (!confirm) {
      __s2 = (char *)0x0;
      goto LAB_001052fb;
    }
    __s2 = (char *)sodium_malloc(0x1000);
    if (__s2 == (char *)0x0) {
      piVar3 = __errno_location();
      *piVar3 = 0xc;
      fmt_00 = "memory error";
      goto LAB_001052e6;
    }
    lVar2 = readpassphrase("[kickpass] confirm: ",__s2,0x1000,2);
    if (lVar2 == 0) {
      fmt_00 = "cannot read password";
      goto LAB_001052e9;
    }
    iVar1 = strncmp(password,__s2,0x1000);
    kVar4 = 0;
    if (iVar1 == 0) goto LAB_001052fb;
    fmt_00 = "mismatching password";
    kVar4 = 2;
    err = 2;
  }
  kp_warn(err,fmt_00);
LAB_001052fb:
  free(local_28);
  free(local_30);
  sodium_free(__s2);
  return kVar4;
}

Assistant:

kp_error_t
kp_readpass(struct kp_ctx *ctx, bool confirm, char *password, const char *fmt, va_list ap)
{
	kp_error_t ret = KP_SUCCESS;
	char *prompt_fmt = NULL, *prompt = NULL;
	char *confirmation = NULL;

	assert(fmt);
	assert(password);

	if (asprintf(&prompt_fmt, PASSWORD_PROMPT, fmt) < 0) {
		kp_err(KP_ERRNO, "cannot build prompt");
	}

	if (vasprintf(&prompt, prompt_fmt, ap) < 0) {
		kp_err(KP_ERRNO, "cannot build prompt");
	}

	if (readpassphrase(prompt, password, KP_PASSWORD_MAX_LEN,
				RPP_ECHO_OFF | RPP_REQUIRE_TTY) == NULL) {
		ret = KP_ERRNO;
		kp_warn(ret, "cannot read password");
		goto out;
	}

	if (confirm) {
		confirmation = sodium_malloc(KP_PASSWORD_MAX_LEN);
		if (!confirmation) {
			errno = ENOMEM;
			ret = KP_ERRNO;
			kp_warn(ret, "memory error");
			goto out;
		}

		if (readpassphrase(PASSWORD_CONFIRM_PROMPT, confirmation,
					KP_PASSWORD_MAX_LEN,
					RPP_ECHO_OFF | RPP_REQUIRE_TTY)
				== NULL) {
			ret = KP_ERRNO;
			kp_warn(ret, "cannot read password");
			goto out;
		}

		if (strncmp(password, confirmation, KP_PASSWORD_MAX_LEN) != 0) {
			ret = KP_EINPUT;
			kp_warn(ret, "mismatching password");
			goto out;
		}
	}

out:
	free(prompt_fmt);
	free(prompt);
	sodium_free(confirmation);

	return ret;
}